

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

unsigned_long __thiscall
lodepng::ExtractZlib::huffmanDecodeSymbol
          (ExtractZlib *this,uchar *in,size_t *bp,HuffmanTree *tree,size_t inlength)

{
  int iVar1;
  HuffmanTree *in_RCX;
  size_t *in_RDX;
  uchar *in_RSI;
  ExtractZlib *in_RDI;
  bool *in_R8;
  size_t treepos;
  unsigned_long ct;
  bool decoded;
  unsigned_long bit;
  size_t *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  byte in_stack_ffffffffffffffcf;
  
  bit = 0;
  do {
    if (((*in_RDX & 7) == 0) && (in_R8 < (bool *)(*in_RDX >> 3))) {
      in_RDI->error = 10;
      return 0;
    }
    readBitFromStream(in_RDI,in_RDX,in_RSI);
    iVar1 = HuffmanTree::decode(in_RCX,in_R8,
                                (unsigned_long *)
                                CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                                in_stack_ffffffffffffffc0,bit);
    in_RDI->error = iVar1;
    if (in_RDI->error != 0) {
      return 0;
    }
  } while ((in_stack_ffffffffffffffcf & 1) == 0);
  return (unsigned_long)in_stack_ffffffffffffffc0;
}

Assistant:

unsigned long huffmanDecodeSymbol(const unsigned char* in, size_t& bp, const HuffmanTree& tree, size_t inlength) {
    //decode a single symbol from given list of bits with given code tree. return value is the symbol
    bool decoded; unsigned long ct;
    for(size_t treepos = 0;;) {
      if((bp & 0x07) == 0 && (bp >> 3) > inlength) { error = 10; return 0; } //error: end reached without endcode
      error = tree.decode(decoded, ct, treepos, readBitFromStream(bp, in));
      if(error) return 0; //stop, an error happened
      if(decoded) return ct;
    }
  }